

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qmainwindow.cpp
# Opt level: O0

void QMainWindow::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long lVar1;
  bool bVar2;
  ToolButtonStyle TVar3;
  TabShape TVar4;
  QSize QVar5;
  QMainWindow *this;
  QtMocHelpers *in_RCX;
  uint in_EDX;
  int in_ESI;
  QMainWindow *in_RDI;
  long in_FS_OFFSET;
  void *_v_1;
  void *_v;
  QMainWindow *_t;
  undefined4 in_stack_ffffffffffffff58;
  QFlagsStorage<QMainWindow::DockOption> in_stack_ffffffffffffff5c;
  QMainWindow *in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff68;
  QSize *pQVar6;
  QFlagsStorage<QMainWindow::DockOption> opt;
  QSize *in_stack_ffffffffffffff70;
  QMainWindow *in_stack_ffffffffffffff78;
  
  opt.i = (Int)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == 0) {
    in_stack_ffffffffffffff78 = (QMainWindow *)(ulong)in_EDX;
    bVar2 = SUB41(in_stack_ffffffffffffff5c.i >> 0x18,0);
    switch(in_stack_ffffffffffffff78) {
    case (QMainWindow *)0x0:
      iconSizeChanged(in_stack_ffffffffffffff60,
                      (QSize *)CONCAT44(in_stack_ffffffffffffff5c.i,in_stack_ffffffffffffff58));
      break;
    case (QMainWindow *)0x1:
      toolButtonStyleChanged((QMainWindow *)0x5eb7db,in_stack_ffffffffffffff5c.i);
      break;
    case (QMainWindow *)0x2:
      tabifiedDockWidgetActivated
                ((QMainWindow *)0x5eb7f3,
                 (QDockWidget *)CONCAT44(in_stack_ffffffffffffff5c.i,in_stack_ffffffffffffff58));
      break;
    case (QMainWindow *)0x3:
      setAnimated(in_stack_ffffffffffffff60,bVar2);
      break;
    case (QMainWindow *)0x4:
      setDockNestingEnabled(in_stack_ffffffffffffff60,bVar2);
      break;
    case (QMainWindow *)0x5:
      setUnifiedTitleAndToolBarOnMac(in_RDI,(bool)(**(byte **)(in_RCX + 8) & 1));
    }
  }
  if ((in_ESI != 5) ||
     (((bVar2 = QtMocHelpers::indexOfMethod<void(QMainWindow::*)(QSize_const&)>
                          (in_RCX,(void **)iconSizeChanged,0,0), !bVar2 &&
       (bVar2 = QtMocHelpers::indexOfMethod<void(QMainWindow::*)(Qt::ToolButtonStyle)>
                          (in_RCX,(void **)toolButtonStyleChanged,0,1), !bVar2)) &&
      (bVar2 = QtMocHelpers::indexOfMethod<void(QMainWindow::*)(QDockWidget*)>
                         (in_RCX,(void **)tabifiedDockWidgetActivated,0,2), !bVar2)))) {
    if (in_ESI == 1) {
      pQVar6 = *(QSize **)in_RCX;
      in_stack_ffffffffffffff70 = (QSize *)(ulong)in_EDX;
      switch(in_stack_ffffffffffffff70) {
      case (QSize *)0x0:
        QVar5 = iconSize(in_stack_ffffffffffffff60);
        *pQVar6 = QVar5;
        break;
      case (QSize *)0x1:
        TVar3 = toolButtonStyle((QMainWindow *)0x5eb97d);
        (pQVar6->wd).m_i = TVar3;
        break;
      case (QSize *)0x2:
        bVar2 = isAnimated(in_stack_ffffffffffffff60);
        *(bool *)&(pQVar6->wd).m_i = bVar2;
        break;
      case (QSize *)0x3:
        bVar2 = documentMode((QMainWindow *)0x5eb9b0);
        *(bool *)&(pQVar6->wd).m_i = bVar2;
        break;
      case (QSize *)0x4:
        TVar4 = tabShape((QMainWindow *)0x5eb9c8);
        (pQVar6->wd).m_i = TVar4;
        break;
      case (QSize *)0x5:
        bVar2 = isDockNestingEnabled(in_stack_ffffffffffffff60);
        *(bool *)&(pQVar6->wd).m_i = bVar2;
        break;
      case (QSize *)0x6:
        dockOptions(in_stack_ffffffffffffff60);
        opt.i = (Int)((ulong)pQVar6 >> 0x20);
        QtMocHelpers::assignFlags<QFlags<QMainWindow::DockOption>>
                  ((void *)0x5eba11,(QFlags<QMainWindow::DockOption>)in_stack_ffffffffffffff5c.i);
        break;
      case (QSize *)0x7:
        bVar2 = unifiedTitleAndToolBarOnMac(in_RDI);
        *(bool *)&(pQVar6->wd).m_i = bVar2;
      }
    }
    if (in_ESI == 2) {
      this = (QMainWindow *)(ulong)in_EDX;
      bVar2 = SUB41(in_stack_ffffffffffffff5c.i >> 0x18,0);
      switch(this) {
      case (QMainWindow *)0x0:
        setIconSize(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
        break;
      case (QMainWindow *)0x1:
        setToolButtonStyle((QMainWindow *)in_stack_ffffffffffffff70,opt.i);
        break;
      case (QMainWindow *)0x2:
        setAnimated(this,bVar2);
        break;
      case (QMainWindow *)0x3:
        setDocumentMode(this,bVar2);
        break;
      case (QMainWindow *)0x4:
        setTabShape(this,in_stack_ffffffffffffff5c.i);
        break;
      case (QMainWindow *)0x5:
        setDockNestingEnabled(this,bVar2);
        break;
      case (QMainWindow *)0x6:
        setDockOptions(this,(DockOptions)opt.i);
        break;
      case (QMainWindow *)0x7:
        setUnifiedTitleAndToolBarOnMac(in_RDI,(bool)(**(byte **)in_RCX & 1));
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMainWindow::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QMainWindow *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->iconSizeChanged((*reinterpret_cast< std::add_pointer_t<QSize>>(_a[1]))); break;
        case 1: _t->toolButtonStyleChanged((*reinterpret_cast< std::add_pointer_t<Qt::ToolButtonStyle>>(_a[1]))); break;
        case 2: _t->tabifiedDockWidgetActivated((*reinterpret_cast< std::add_pointer_t<QDockWidget*>>(_a[1]))); break;
        case 3: _t->setAnimated((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 4: _t->setDockNestingEnabled((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 5: _t->setUnifiedTitleAndToolBarOnMac((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QMainWindow::*)(const QSize & )>(_a, &QMainWindow::iconSizeChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QMainWindow::*)(Qt::ToolButtonStyle )>(_a, &QMainWindow::toolButtonStyleChanged, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QMainWindow::*)(QDockWidget * )>(_a, &QMainWindow::tabifiedDockWidgetActivated, 2))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QSize*>(_v) = _t->iconSize(); break;
        case 1: *reinterpret_cast<Qt::ToolButtonStyle*>(_v) = _t->toolButtonStyle(); break;
        case 2: *reinterpret_cast<bool*>(_v) = _t->isAnimated(); break;
        case 3: *reinterpret_cast<bool*>(_v) = _t->documentMode(); break;
        case 4: *reinterpret_cast<QTabWidget::TabShape*>(_v) = _t->tabShape(); break;
        case 5: *reinterpret_cast<bool*>(_v) = _t->isDockNestingEnabled(); break;
        case 6: QtMocHelpers::assignFlags<DockOptions>(_v, _t->dockOptions()); break;
        case 7: *reinterpret_cast<bool*>(_v) = _t->unifiedTitleAndToolBarOnMac(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setIconSize(*reinterpret_cast<QSize*>(_v)); break;
        case 1: _t->setToolButtonStyle(*reinterpret_cast<Qt::ToolButtonStyle*>(_v)); break;
        case 2: _t->setAnimated(*reinterpret_cast<bool*>(_v)); break;
        case 3: _t->setDocumentMode(*reinterpret_cast<bool*>(_v)); break;
        case 4: _t->setTabShape(*reinterpret_cast<QTabWidget::TabShape*>(_v)); break;
        case 5: _t->setDockNestingEnabled(*reinterpret_cast<bool*>(_v)); break;
        case 6: _t->setDockOptions(*reinterpret_cast<DockOptions*>(_v)); break;
        case 7: _t->setUnifiedTitleAndToolBarOnMac(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
}